

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::RGBIlluminantSpectrum::Sample(RGBIlluminantSpectrum *this,SampledWavelengths *lambda)

{
  float fVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  Float FVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [56];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar7;
  SampledSpectrum s;
  SampledSpectrum local_48;
  SampledSpectrum local_30;
  
  local_48.values.values = (array<float,_4>)(ZEXT816(0) << 0x40);
  auVar5 = ZEXT1664((undefined1  [16])local_48.values.values);
  for (lVar3 = 0; auVar6 = auVar5._8_56_, lVar3 != 4; lVar3 = lVar3 + 1) {
    fVar1 = this->scale;
    FVar4 = RGBSigmoidPolynomial::operator()(&this->rsp,(lambda->lambda).values[lVar3]);
    fVar1 = FVar4 * fVar1;
    auVar5 = ZEXT464((uint)fVar1);
    local_48.values.values[lVar3] = fVar1;
  }
  SVar7 = DenselySampledSpectrum::Sample(this->illuminant,lambda);
  auVar5._0_8_ = SVar7.values.values._0_8_;
  auVar5._8_56_ = auVar6;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar7.values.values._8_8_;
  local_30.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar2);
  SVar7 = SampledSpectrum::operator*(&local_48,&local_30);
  return (array<float,_4>)(array<float,_4>)SVar7;
}

Assistant:

Sample(const SampledWavelengths &lambda) const {
        SampledSpectrum s;
        for (int i = 0; i < NSpectrumSamples; ++i)
            s[i] = scale * rsp(lambda[i]);
        return s * illuminant->Sample(lambda);
    }